

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)62,_(unsigned_short)29>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  
  puVar4 = *in;
  uVar1 = puVar4[2];
  out[0x1d] = (ulong)(uVar1 & 0xf) << 0x3a | (ulong)puVar4[1] << 0x1a | (ulong)(*puVar4 >> 6);
  uVar2 = puVar4[3];
  *in = puVar4 + 4;
  uVar3 = puVar4[4];
  out[0x1e] = (ulong)(uVar3 & 3) << 0x3c | (ulong)uVar2 << 0x1c | (ulong)(uVar1 >> 4);
  out[0x1f] = (ulong)puVar4[5] << 0x1e | (ulong)(uVar3 >> 2);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}